

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O3

void __thiscall MC::MC_Driver::parse(MC_Driver *this,char *filename)

{
  ifstream in_file;
  long local_218 [4];
  int aiStack_1f8 [122];
  
  if (filename == (char *)0x0) {
    __assert_fail("filename != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Cjkkkk[P]minisql/mc_driver.cpp"
                  ,0x22,"void MC::MC_Driver::parse(const char *const)");
  }
  std::ifstream::ifstream(local_218,filename,_S_in);
  if (*(int *)((long)aiStack_1f8 + *(long *)(local_218[0] + -0x18)) == 0) {
    parse_helper(this,(istream *)local_218);
    std::ifstream::~ifstream(local_218);
    return;
  }
  exit(1);
}

Assistant:

void 
MC::MC_Driver::parse( const char * const filename )
{
   /**
    * Remember, if you want to have checks in release mode
    * then this needs to be an if statement 
    */
   assert( filename != nullptr );
   std::ifstream in_file( filename );
   if( ! in_file.good() )
   {
       exit( EXIT_FAILURE );
   }
   parse_helper( in_file );
   return;
}